

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O2

void duckdb::
     LeastGreatestFunction<duckdb::string_t,duckdb::GreaterThan,duckdb::SortKeyLeastGreatest>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  data_ptr_t pdVar1;
  string_t *psVar2;
  unsigned_long *puVar3;
  data_ptr_t pdVar4;
  bool bVar5;
  reference pvVar6;
  DataChunk *this;
  Vector *pVVar7;
  ulong uVar8;
  pointer pVVar9;
  string_t *psVar10;
  VectorType vector_type_p;
  idx_t col_idx;
  ulong uVar11;
  ulong uVar12;
  pointer pVVar13;
  string_t ivalue;
  UnifiedVectorFormat vdata;
  bool result_has_value [2048];
  
  if ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start == 0x68) {
    pvVar6 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
    Vector::Reference(result,pvVar6);
    return;
  }
  this = SortKeyLeastGreatest::Prepare(args,state);
  pVVar7 = SortKeyLeastGreatest::TargetVector(result,state);
  vector_type_p = CONSTANT_VECTOR;
  uVar11 = 0;
  while( true ) {
    pVVar9 = (this->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar13 = (this->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((ulong)(((long)pVVar13 - (long)pVVar9) / 0x68) <= uVar11) break;
    pvVar6 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar11);
    if (pvVar6->vector_type != CONSTANT_VECTOR) {
      vector_type_p = FLAT_VECTOR;
    }
    uVar11 = uVar11 + 1;
  }
  psVar2 = (string_t *)pVVar7->data;
  uVar11 = 0;
  switchD_014c3389::default(result_has_value,0,0x800);
  do {
    if ((ulong)(((long)pVVar13 - (long)pVVar9) / 0x68) <= uVar11) {
      SortKeyLeastGreatest::FinalizeResult(this->count,result_has_value,result,state);
      Vector::SetVectorType(result,vector_type_p);
      return;
    }
    pvVar6 = vector<duckdb::Vector,_true>::get<true>(&this->data,uVar11);
    if (pvVar6->vector_type == CONSTANT_VECTOR) {
      pvVar6 = vector<duckdb::Vector,_true>::get<true>(&this->data,uVar11);
      puVar3 = (pvVar6->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) goto LAB_01cf7b34;
    }
    else {
LAB_01cf7b34:
      UnifiedVectorFormat::UnifiedVectorFormat(&vdata);
      pvVar6 = vector<duckdb::Vector,_true>::get<true>(&this->data,uVar11);
      Vector::ToUnifiedFormat(pvVar6,this->count,&vdata);
      pdVar4 = vdata.data;
      if (vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        psVar10 = psVar2;
        for (uVar12 = 0; uVar12 < this->count; uVar12 = uVar12 + 1) {
          uVar8 = uVar12;
          if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar8 = (ulong)(vdata.sel)->sel_vector[uVar12];
          }
          pdVar1 = pdVar4 + uVar8 * 0x10;
          ivalue.value._0_8_ = *(undefined8 *)pdVar1;
          ivalue.value.pointer.ptr = (char *)*(undefined8 *)(pdVar1 + 8);
          if (result_has_value[uVar12] == true) {
            bVar5 = string_t::StringComparisonOperators::GreaterThan(&ivalue,psVar10);
            if (bVar5) goto LAB_01cf7c3f;
          }
          else {
LAB_01cf7c3f:
            result_has_value[uVar12] = true;
            *(undefined8 *)&psVar10->value = ivalue.value._0_8_;
            (psVar10->value).pointer.ptr = ivalue.value.pointer.ptr;
          }
          psVar10 = psVar10 + 1;
        }
      }
      else {
        psVar10 = psVar2;
        for (uVar12 = 0; uVar12 < this->count; uVar12 = uVar12 + 1) {
          uVar8 = uVar12;
          if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar8 = (ulong)(vdata.sel)->sel_vector[uVar12];
          }
          if ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0) ||
             ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar8 >> 6]
               >> (uVar8 & 0x3f) & 1) != 0)) {
            pdVar1 = pdVar4 + uVar8 * 0x10;
            ivalue.value._0_8_ = *(undefined8 *)pdVar1;
            ivalue.value.pointer.ptr = (char *)*(undefined8 *)(pdVar1 + 8);
            if (result_has_value[uVar12] == true) {
              bVar5 = string_t::StringComparisonOperators::GreaterThan(&ivalue,psVar10);
              if (!bVar5) goto LAB_01cf7beb;
            }
            result_has_value[uVar12] = true;
            *(undefined8 *)&psVar10->value = ivalue.value._0_8_;
            (psVar10->value).pointer.ptr = ivalue.value.pointer.ptr;
          }
LAB_01cf7beb:
          psVar10 = psVar10 + 1;
        }
      }
      UnifiedVectorFormat::~UnifiedVectorFormat(&vdata);
    }
    uVar11 = uVar11 + 1;
    pVVar9 = (this->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar13 = (this->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}